

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int *piVar1;
  istream *this;
  pair<int,_int> *this_00;
  iterator piVar2;
  ostream *poVar3;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int> *__range1;
  pair<int,_int> local_6c;
  int local_64;
  int local_60;
  int b;
  int a;
  int i_1;
  int i;
  undefined1 local_48 [8];
  vector<std::pair<int,_int>_> data;
  vector<int> v;
  int local_10;
  int m;
  int n;
  
  m = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::vector<int>::vector((vector<int> *)&data.mSize);
  CP::vector<std::pair<int,_int>_>::vector((vector<std::pair<int,_int>_> *)local_48);
  std::istream::operator>>((istream *)&std::cin,&local_10);
  CP::vector<int>::resize((vector<int> *)&data.mSize,(long)local_10);
  for (a = 0; a < local_10; a = a + 1) {
    piVar1 = CP::vector<int>::operator[]((vector<int> *)&data.mSize,a);
    std::istream::operator>>((istream *)&std::cin,piVar1);
  }
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&v.mSize + 4));
  CP::vector<std::pair<int,_int>_>::resize
            ((vector<std::pair<int,_int>_> *)local_48,(long)v.mSize._4_4_);
  for (b = 0; b < v.mSize._4_4_; b = b + 1) {
    this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_60);
    std::istream::operator>>(this,&local_64);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_6c,&local_60,&local_64);
    this_00 = CP::vector<std::pair<int,_int>_>::operator[]
                        ((vector<std::pair<int,_int>_> *)local_48,b);
    std::pair<int,_int>::operator=(this_00,&local_6c);
  }
  CP::vector<std::pair<int,_int>_>::vector
            ((vector<std::pair<int,_int>_> *)&__range1,(vector<std::pair<int,_int>_> *)local_48);
  CP::vector<int>::insert_many((vector<int> *)&data.mSize,(vector<std::pair<int,_int>_> *)&__range1)
  ;
  CP::vector<std::pair<int,_int>_>::~vector((vector<std::pair<int,_int>_> *)&__range1);
  __end1 = CP::vector<int>::begin((vector<int> *)&data.mSize);
  piVar2 = CP::vector<int>::end((vector<int> *)&data.mSize);
  for (; __end1 != piVar2; __end1 = __end1 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*__end1);
    std::operator<<(poVar3," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  CP::vector<std::pair<int,_int>_>::~vector((vector<std::pair<int,_int>_> *)local_48);
  CP::vector<int>::~vector((vector<int> *)&data.mSize);
  return m;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  int n,m;
  CP::vector<int> v;
  CP::vector<std::pair<int,int>> data;
  std::cin >> n;
  v.resize(n);
  for (int i = 0;i < n;i++)  {
    std::cin >> v[i];
  }
  std::cin >> m;
  data.resize(m);
  for (int i = 0;i < m;i++) {
    int a,b;
    std::cin >> a >> b;
    data[i] = {a,b};
  }


  v.insert_many(data);
  for (auto &x : v) {
    std::cout << x << " ";
  }
  std::cout << std::endl;

}